

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

char * ImGui::TableGetColumnName(ImGuiTable *table,int column_n)

{
  ImGuiTableColumn *pIVar1;
  ImGuiTableColumn *column;
  int column_n_local;
  ImGuiTable *table_local;
  
  if (((table->IsLayoutLocked & 1U) == 0) && (table->DeclColumnsCount <= column_n)) {
    table_local = (ImGuiTable *)0x2a45ac;
  }
  else {
    pIVar1 = ImSpan<ImGuiTableColumn>::operator[](&table->Columns,column_n);
    if (pIVar1->NameOffset == -1) {
      table_local = (ImGuiTable *)0x2a45ac;
    }
    else {
      table_local = (ImGuiTable *)
                    ImVector<char>::operator[](&(table->ColumnsNames).Buf,(int)pIVar1->NameOffset);
    }
  }
  return (char *)table_local;
}

Assistant:

const char* ImGui::TableGetColumnName(const ImGuiTable* table, int column_n)
{
    if (table->IsLayoutLocked == false && column_n >= table->DeclColumnsCount)
        return ""; // NameOffset is invalid at this point
    const ImGuiTableColumn* column = &table->Columns[column_n];
    if (column->NameOffset == -1)
        return "";
    return &table->ColumnsNames.Buf[column->NameOffset];
}